

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O2

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_cover_from_function(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  double *pdVar1;
  int iVar2;
  _Self __tmp;
  ostream *poVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  mapped_type_conflict1 *pmVar6;
  _Rb_tree_node_base *p_Var7;
  int i;
  ulong uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_1a0;
  double local_198;
  int local_190;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> intervals;
  int id;
  vector<int,_std::allocator<int>_> points;
  pair<double,_double> interm;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  preimages;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> funcstd;
  mutex idmutex;
  mutex covermutex;
  
  dVar16 = this->resolution_double;
  if (((dVar16 != -1.0) || (NAN(dVar16))) || (this->resolution_int != -1)) {
    if ((this->gain != -1.0) || (NAN(this->gain))) {
      uVar8 = 0;
      uVar4 = (ulong)(uint)this->num_points;
      if (this->num_points < 1) {
        uVar4 = uVar8;
      }
      dVar13 = -3.4028234663852886e+38;
      dVar17 = 3.4028234663852886e+38;
      for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        dVar15 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        dVar14 = dVar15;
        if (dVar17 <= dVar15) {
          dVar14 = dVar17;
        }
        if (dVar15 <= dVar13) {
          dVar15 = dVar13;
        }
        dVar13 = dVar15;
        dVar17 = dVar14;
      }
      if (this->verbose != false) {
        std::operator<<((ostream *)&std::clog,"Min function value = ");
        poVar3 = std::ostream::_M_insert<double>(dVar17);
        std::operator<<(poVar3," and Max function value = ");
        poVar3 = std::ostream::_M_insert<double>(dVar13);
        std::endl<char,std::char_traits<char>>(poVar3);
        dVar16 = this->resolution_double;
      }
      intervals.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      intervals.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      intervals.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((dVar16 != -1.0) || (NAN(dVar16))) {
        iVar9 = this->resolution_int;
        dVar15 = dVar17 + dVar16;
        if (iVar9 == -1) {
          while ((interm.first = dVar17, dVar15 <= dVar13 &&
                 (dVar16 <= dVar13 - (dVar15 - this->gain * dVar16)))) {
            interm.second = dVar15;
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back(&intervals,&interm);
            dVar16 = this->resolution_double;
            dVar17 = dVar15 - this->gain * dVar16;
            dVar15 = dVar16 + dVar17;
          }
          interm.second = dVar13;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back(&intervals,&interm);
          uVar4 = (ulong)((long)intervals.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)intervals.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4;
          local_190 = (int)uVar4;
          if (this->verbose == true) {
            lVar12 = 0;
            uVar8 = 0;
            if (0 < local_190) {
              uVar8 = uVar4 & 0xffffffff;
            }
            for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
              poVar3 = std::operator<<((ostream *)&std::clog,"Interval ");
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar4);
              std::operator<<(poVar3," = [");
              poVar3 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   ((long)&(intervals.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first +
                                   lVar12));
              std::operator<<(poVar3,", ");
              poVar3 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   ((long)&(intervals.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->second +
                                   lVar12));
              poVar3 = std::operator<<(poVar3,"]");
              std::endl<char,std::char_traits<char>>(poVar3);
              lVar12 = lVar12 + 0x10;
            }
          }
        }
        else {
          iVar2 = 0;
          while (((iVar2 < iVar9 && (dVar15 <= dVar13)) &&
                 (dVar16 <= dVar13 - (dVar15 - this->gain * dVar16)))) {
            interm.first = dVar17;
            interm.second = dVar15;
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back(&intervals,&interm);
            iVar2 = iVar2 + 1;
            dVar16 = this->resolution_double;
            dVar17 = dVar15 - this->gain * dVar16;
            iVar9 = this->resolution_int;
            dVar15 = dVar16 + dVar17;
          }
          uVar4 = (ulong)((long)intervals.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)intervals.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4;
          local_190 = (int)uVar4;
          if (this->verbose == true) {
            lVar12 = 0;
            uVar8 = 0;
            if (0 < local_190) {
              uVar8 = uVar4 & 0xffffffff;
            }
            for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
              poVar3 = std::operator<<((ostream *)&std::clog,"Interval ");
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar4);
              std::operator<<(poVar3," = [");
              poVar3 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   ((long)&(intervals.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first +
                                   lVar12));
              std::operator<<(poVar3,", ");
              poVar3 = std::ostream::_M_insert<double>
                                 (*(double *)
                                   ((long)&(intervals.
                                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->second +
                                   lVar12));
              poVar3 = std::operator<<(poVar3,"]");
              std::endl<char,std::char_traits<char>>(poVar3);
              lVar12 = lVar12 + 0x10;
            }
          }
        }
      }
      else {
        dVar15 = (dVar13 - dVar17) / (double)this->resolution_int;
        dVar16 = this->gain;
        dVar16 = (dVar16 * dVar15) / (2.0 - (dVar16 + dVar16));
        interm.second = dVar17 + dVar15 + dVar16;
        interm.first = dVar17;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back(&intervals,&interm);
        iVar9 = 1;
        while (iVar2 = this->resolution_int + -1, iVar9 < iVar2) {
          preimages._M_t._M_impl._0_8_ = ((double)iVar9 * dVar15 + dVar17) - dVar16;
          iVar9 = iVar9 + 1;
          preimages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (double)iVar9 * dVar15 + dVar17 + dVar16;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          push_back(&intervals,(value_type *)&preimages);
        }
        preimages._M_t._M_impl._0_8_ = ((double)iVar2 * dVar15 + dVar17) - dVar16;
        preimages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = dVar13;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        push_back(&intervals,(value_type *)&preimages);
        uVar4 = (ulong)((long)intervals.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)intervals.
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4;
        local_190 = (int)uVar4;
        if (this->verbose == true) {
          lVar12 = 0;
          uVar8 = 0;
          if (0 < local_190) {
            uVar8 = uVar4 & 0xffffffff;
          }
          for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
            poVar3 = std::operator<<((ostream *)&std::clog,"Interval ");
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)uVar4);
            std::operator<<(poVar3," = [");
            poVar3 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(intervals.
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar12
                                 ));
            std::operator<<(poVar3,", ");
            poVar3 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)&(intervals.
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second +
                                 lVar12));
            poVar3 = std::operator<<(poVar3,"]");
            std::endl<char,std::char_traits<char>>(poVar3);
            lVar12 = lVar12 + 0x10;
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&points,(long)this->num_points,(allocator_type *)&interm);
      for (lVar12 = 0; lVar12 < this->num_points; lVar12 = lVar12 + 1) {
        points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] = (int)lVar12;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::cover_complex::Cover_complex<std::vector<float,std::allocator<float>>>::set_cover_from_function()::_lambda(int,int)_1_>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Nerve_GIC_include_gudhi_GIC_h:688:45)>
                  )this);
      preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      preimages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           preimages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      funcstd._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &funcstd._M_t._M_impl.super__Rb_tree_header._M_header;
      funcstd._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      funcstd._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      funcstd._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      funcstd._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           funcstd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (this->verbose == true) {
        poVar3 = std::operator<<((ostream *)&std::clog,"Computing preimages...");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      iVar9 = 0;
      uVar4 = 0;
      while( true ) {
        iVar2 = (int)uVar4;
        interm.first = (double)CONCAT44(interm.first._4_4_,iVar9);
        if (local_190 <= iVar9) break;
        dVar16 = intervals.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar9].second;
        lVar12 = (long)iVar2;
        if (iVar9 == local_190 + -1) {
          local_198 = intervals.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)(local_190 + -1) + -1].second;
          lVar10 = lVar12 * 4;
          uVar8 = uVar4 & 0xffffffff;
          for (; (pdVar1 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start +
                           points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar12], iVar9 = this->num_points,
                 *pdVar1 <= local_198 && local_198 != *pdVar1 && ((int)lVar12 != iVar9));
              lVar12 = lVar12 + 1) {
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&preimages,(key_type *)&interm);
            std::vector<int,_std::allocator<int>_>::push_back
                      (pmVar5,(value_type_conflict1 *)
                              ((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar10));
            lVar10 = lVar10 + 4;
            uVar8 = (ulong)((int)uVar8 + 1);
          }
          for (; local_1a0 = dVar16, (int)uVar8 != iVar9; uVar8 = (ulong)((int)uVar8 + 1)) {
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&preimages,(key_type *)&interm);
            std::vector<int,_std::allocator<int>_>::push_back
                      (pmVar5,(value_type_conflict1 *)
                              ((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar10));
            iVar9 = this->num_points;
            lVar10 = lVar10 + 4;
          }
        }
        else {
          if (iVar9 == 0) {
            local_198 = intervals.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar9].first;
            lVar12 = 0;
          }
          else {
            local_198 = (intervals.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar9)[-1].second;
            lVar12 = lVar12 << 2;
            while ((iVar2 = (int)uVar4,
                   pdVar1 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start +
                            *(int *)((long)points.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar12),
                   *pdVar1 <= local_198 && local_198 != *pdVar1 && (iVar2 != this->num_points))) {
              pmVar5 = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&preimages,(key_type *)&interm);
              std::vector<int,_std::allocator<int>_>::push_back
                        (pmVar5,(value_type_conflict1 *)
                                ((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar12));
              lVar12 = lVar12 + 4;
              uVar4 = (ulong)(iVar2 + 1);
            }
            lVar12 = (long)interm.first._0_4_;
          }
          local_1a0 = intervals.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar12 + 1].first;
          uVar4 = (ulong)iVar2;
          lVar12 = uVar4 * 4;
          while( true ) {
            dVar13 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4]];
            iVar9 = this->num_points;
            if ((local_1a0 <= dVar13) || ((int)uVar4 == iVar9)) break;
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&preimages,(key_type *)&interm);
            std::vector<int,_std::allocator<int>_>::push_back
                      (pmVar5,(value_type_conflict1 *)
                              ((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar12));
            uVar4 = uVar4 + 1;
            lVar12 = lVar12 + 4;
            iVar2 = iVar2 + 1;
          }
          for (; (dVar13 < dVar16 && (iVar2 != iVar9)); iVar2 = iVar2 + 1) {
            pmVar5 = std::
                     map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ::operator[](&preimages,(key_type *)&interm);
            std::vector<int,_std::allocator<int>_>::push_back
                      (pmVar5,(value_type_conflict1 *)
                              ((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar12));
            dVar13 = (this->func).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [*(int *)((long)points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar12 + 4)];
            iVar9 = this->num_points;
            lVar12 = lVar12 + 4;
          }
        }
        pmVar6 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&funcstd,(key_type *)&interm);
        *pmVar6 = (local_198 + local_1a0) * 0.5;
        iVar9 = interm.first._0_4_ + 1;
      }
      if (this->verbose != false) {
        poVar3 = std::operator<<((ostream *)&std::clog,
                                 "Computing connected components (parallelized)...");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      interm.first = (double)this;
      interm.second = (double)&preimages;
      tbb::detail::d1::
      parallel_for<int,Gudhi::cover_complex::Cover_complex<std::vector<float,std::allocator<float>>>::set_cover_from_function()::_lambda(int)_1_>
                (0,local_190,(anon_class_56_7_c320dfda *)&interm);
      this->maximal_dim = -1;
      for (p_Var7 = (this->cover_color)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(this->cover_color)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        p_Var7[1]._M_left =
             (_Base_ptr)((double)p_Var7[1]._M_left / (double)*(int *)&p_Var7[1]._M_parent);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&funcstd._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&preimages._M_t);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&points.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
      ~_Vector_base(&intervals.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   );
      return;
    }
    pcVar11 = "Gain not specified";
  }
  else {
    pcVar11 = "Number and/or length of intervals not specified";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar11);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void set_cover_from_function() {
    if (resolution_double == -1 && resolution_int == -1) {
      std::cerr << "Number and/or length of intervals not specified" << std::endl;
      return;
    }
    if (gain == -1) {
      std::cerr << "Gain not specified" << std::endl;
      return;
    }

    // Read function values and compute min and max
    double minf = (std::numeric_limits<float>::max)();
    double maxf = std::numeric_limits<float>::lowest();
    for (int i = 0; i < this->num_points; i++) {
      minf = (std::min)(minf, func[i]);
      maxf = (std::max)(maxf, func[i]);
    }
    if (verbose) std::clog << "Min function value = " << minf << " and Max function value = " << maxf << std::endl;

    // Compute cover of im(f)
    std::vector<std::pair<double, double> > intervals;
    int res;

    if (resolution_double == -1) {  // Case we use an integer for the number of intervals.
      double incr = (maxf - minf) / resolution_int;
      double x = minf;
      double alpha = (incr * gain) / (2 - 2 * gain);
      double y = minf + incr + alpha;
      std::pair<double, double> interm(x, y);
      intervals.push_back(interm);
      for (int i = 1; i < resolution_int - 1; i++) {
        x = minf + i * incr - alpha;
        y = minf + (i + 1) * incr + alpha;
        std::pair<double, double> inter(x, y);
        intervals.push_back(inter);
      }
      x = minf + (resolution_int - 1) * incr - alpha;
      y = maxf;
      std::pair<double, double> interM(x, y);
      intervals.push_back(interM);
      res = intervals.size();
      if (verbose) {
        for (int i = 0; i < res; i++)
          std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                    << std::endl;
      }
    } else {
      if (resolution_int == -1) {  // Case we use a double for the length of the intervals.
        double x = minf;
        double y = x + resolution_double;
        while (y <= maxf && maxf - (y - gain * resolution_double) >= resolution_double) {
          std::pair<double, double> inter(x, y);
          intervals.push_back(inter);
          x = y - gain * resolution_double;
          y = x + resolution_double;
        }
        std::pair<double, double> interM(x, maxf);
        intervals.push_back(interM);
        res = intervals.size();
        if (verbose) {
          for (int i = 0; i < res; i++)
            std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                      << std::endl;
        }
      } else {  // Case we use an integer and a double for the length of the intervals.
        double x = minf;
        double y = x + resolution_double;
        int count = 0;
        while (count < resolution_int && y <= maxf && maxf - (y - gain * resolution_double) >= resolution_double) {
          std::pair<double, double> inter(x, y);
          intervals.push_back(inter);
          count++;
          x = y - gain * resolution_double;
          y = x + resolution_double;
        }
        res = intervals.size();
        if (verbose) {
          for (int i = 0; i < res; i++)
            std::clog << "Interval " << i << " = [" << intervals[i].first << ", " << intervals[i].second << "]"
                      << std::endl;
        }
      }
    }

    // Sort points according to function values
    std::vector<int> points(this->num_points);
    for (int i = 0; i < this->num_points; i++) points[i] = i;
    std::sort(points.begin(), points.end(), [this](int p1, int p2){return (this->func[p1] < this->func[p2]);});

    int id = 0;
    int pos = 0;
    Index_map index = boost::get(boost::vertex_index, one_skeleton);  // int maxc = -1;
    std::map<int, std::vector<int> > preimages;
    std::map<int, double> funcstd;

    if (verbose) std::clog << "Computing preimages..." << std::endl;
    for (int i = 0; i < res; i++) {
      // Find points in the preimage
      std::pair<double, double> inter1 = intervals[i];
      int tmp = pos;
      double u, v;

      if (i != res - 1) {
        if (i != 0) {
          std::pair<double, double> inter3 = intervals[i - 1];
          while (func[points[tmp]] < inter3.second && tmp != this->num_points) {
            preimages[i].push_back(points[tmp]);
            tmp++;
          }
          u = inter3.second;
        } else {
          u = inter1.first;
        }

        std::pair<double, double> inter2 = intervals[i + 1];
        while (func[points[tmp]] < inter2.first && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        v = inter2.first;
        pos = tmp;
        while (func[points[tmp]] < inter1.second && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }

      } else {
        std::pair<double, double> inter3 = intervals[i - 1];
        while (func[points[tmp]] < inter3.second && tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        while (tmp != this->num_points) {
          preimages[i].push_back(points[tmp]);
          tmp++;
        }
        u = inter3.second;
        v = inter1.second;
      }

      funcstd[i] = 0.5 * (u + v);
    }

    #ifdef GUDHI_USE_TBB
      if (verbose) std::clog << "Computing connected components (parallelized)..." << std::endl;
      std::mutex covermutex, idmutex;
      tbb::parallel_for(0, res, [&](int i){
        // Compute connected components
        Graph G = one_skeleton.create_subgraph();
        int num = preimages[i].size();
        std::vector<int> component(num);
        for (int j = 0; j < num; j++) boost::add_vertex(index[vertices[preimages[i][j]]], G);
        boost::connected_components(G, &component[0]);
        int max = 0;

        // For each point in preimage
        for (int j = 0; j < num; j++) {
          // Update number of components in preimage
          if (component[j] > max) max = component[j];

          // Identify component with Cantor polynomial N^2 -> N
          int identifier = ((i + component[j])*(i + component[j]) + 3 * i + component[j]) / 2;

          // Update covers
          covermutex.lock();
          cover[preimages[i][j]].push_back(identifier);
          cover_back[identifier].push_back(preimages[i][j]);
          cover_fct[identifier] = i;
          cover_std[identifier] = funcstd[i];
          cover_color[identifier].second += func_color[preimages[i][j]];
          cover_color[identifier].first += 1;
          covermutex.unlock();
        }

        // Maximal dimension is total number of connected components
        idmutex.lock();
        id += max + 1;
        idmutex.unlock();
      });
    #else
      if (verbose) std::clog << "Computing connected components..." << std::endl;
      for (int i = 0; i < res; i++) {
        // Compute connected components
        Graph G = one_skeleton.create_subgraph();
        int num = preimages[i].size();
        std::vector<int> component(num);
        for (int j = 0; j < num; j++) boost::add_vertex(index[vertices[preimages[i][j]]], G);
        boost::connected_components(G, &component[0]);
        int max = 0;

        // For each point in preimage
        for (int j = 0; j < num; j++) {
          // Update number of components in preimage
          if (component[j] > max) max = component[j];

          // Identify component with Cantor polynomial N^2 -> N
          int identifier = (std::pow(i + component[j], 2) + 3 * i + component[j]) / 2;

          // Update covers
          cover[preimages[i][j]].push_back(identifier);
          cover_back[identifier].push_back(preimages[i][j]);
          cover_fct[identifier] = i;
          cover_std[identifier] = funcstd[i];
          cover_color[identifier].second += func_color[preimages[i][j]];
          cover_color[identifier].first += 1;
        }

        // Maximal dimension is total number of connected components
        id += max + 1;
      }
    #endif

    maximal_dim = id - 1;
    for (std::map<int, std::pair<int, double> >::iterator iit = cover_color.begin(); iit != cover_color.end(); iit++)
      iit->second.second /= iit->second.first;
  }